

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

bool __thiscall CHIP8::loadROM(CHIP8 *this,string *filename)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  void *__src;
  bool bVar4;
  ifstream in;
  string local_230 [520];
  
  std::ifstream::ifstream(local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Loading program: ",0x11)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,filename->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ifstream::open(local_230,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Program couldn\'t be opened!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  else {
    std::istream::seekg((long)local_230,_S_beg);
    uVar2 = std::istream::tellg();
    std::istream::seekg((long)local_230,_S_beg);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nProgram loaded : ",0x12);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nSize(bytes)    : ",0x12);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    __src = operator_new__((long)(int)uVar2);
    std::istream::read((char *)local_230,(long)__src);
    bVar4 = (int)uVar2 < 0xe00;
    if ((int)uVar2 < 0xe00) {
      if (0 < (int)uVar2) {
        memcpy(this->memory + 0x200,__src,(ulong)(uVar2 & 0x7fffffff));
      }
      operator_delete__(__src);
      std::ifstream::close();
      goto LAB_00102d4f;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Program too big to fit in memory!",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::ifstream::close();
  }
  bVar4 = false;
LAB_00102d4f:
  std::ifstream::~ifstream(local_230);
  return bVar4;
}

Assistant:

bool CHIP8::loadROM(const std::string &filename){
    std::ifstream in;
    std::cerr << "Loading program: " << filename << std::endl;
    in.open(filename, std::ios::in | std::ios::binary);

    if(!in.is_open()){
        std::cerr << "Program couldn't be opened!" << std::endl;
        return false;
    }

    // get length of file:
    in.seekg (0, in.end);
    int length = in.tellg();
    in.seekg (0, in.beg);

    std::cerr << "\nProgram loaded : " << filename
              << "\nSize(bytes)    : " << length
              << "\n" << std::endl;

    char *buffer = new char[length];

    in.read(buffer, length);

    if (length < 4096 - 512){
        for (int i = 0; i < length; ++i){
            memory[512 + i] = buffer[i];
        }
    }
    else{
        std::cerr << "Program too big to fit in memory!" << std::endl;
        in.close();
        return false;
    }

    delete[] buffer;
    in.close();
    return true;
}